

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall Preprocessor::parseDefineArguments(Preprocessor *this,Macro *m)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  Token TVar4;
  long lVar5;
  long lVar6;
  Token *pTVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  Symbol *pSVar11;
  long in_FS_OFFSET;
  Symbol arg;
  QByteArray local_c0;
  undefined8 local_a8;
  QArrayData *pQStack_a0;
  char *local_98;
  qsizetype qStack_90;
  qsizetype local_88;
  qsizetype qStack_80;
  QByteArray local_78;
  QArrayDataPointer<Symbol> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (Symbol *)0x0;
  local_58.size = 0;
  do {
    lVar1 = (this->super_Parser).symbols.d.size;
    if (lVar1 <= (this->super_Parser).index) break;
    lVar5 = (this->super_Parser).index;
    if (lVar5 < lVar1) {
      pTVar7 = &(this->super_Parser).symbols.d.ptr[lVar5].token;
      do {
        lVar5 = lVar5 + 1;
        if (*pTVar7 != PP_WHITESPACE) break;
        (this->super_Parser).index = lVar5;
        pTVar7 = pTVar7 + 0xc;
      } while (lVar5 != lVar1);
    }
    lVar5 = (this->super_Parser).index;
    TVar4 = NOTOKEN;
    if (lVar5 < lVar1) {
      (this->super_Parser).index = lVar5 + 1;
      TVar4 = (this->super_Parser).symbols.d.ptr[lVar5].token;
    }
    if (TVar4 == IDENTIFIER) {
LAB_001352c0:
      pSVar11 = (this->super_Parser).symbols.d.ptr;
      lVar1 = (this->super_Parser).index;
      local_a8 = *(char **)(pSVar11 + lVar1 + -1);
      pQStack_a0 = &(pSVar11[lVar1 + -1].lex.d.d)->super_QArrayData;
      local_98 = pSVar11[lVar1 + -1].lex.d.ptr;
      qStack_90 = pSVar11[lVar1 + -1].lex.d.size;
      if (pQStack_a0 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQStack_a0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQStack_a0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_88 = pSVar11[lVar1 + -1].from;
      qStack_80 = pSVar11[lVar1 + -1].len;
      if (local_58.size == 0) {
LAB_0013538a:
        lVar10 = -1;
      }
      else {
        lVar1 = local_58.size * 0x30;
        lVar5 = 0x30 - (long)local_58.ptr;
        pSVar11 = local_58.ptr;
        do {
          lVar10 = lVar5;
          lVar6 = lVar1;
          if (lVar6 == 0) goto LAB_00135385;
          bVar2 = Symbol::operator==(pSVar11,(Symbol *)&local_a8);
          pSVar11 = pSVar11 + 1;
          lVar1 = lVar6 + -0x30;
          lVar5 = lVar10 + -0x30;
        } while (!bVar2);
        lVar10 = (-((long)&local_58.ptr[-1].lineNum + lVar10) >> 4) * -0x5555555555555555;
LAB_00135385:
        if (lVar6 == 0) goto LAB_0013538a;
      }
      if (lVar10 != -1) {
        pcVar8 = "Duplicate macro parameter.";
        goto LAB_00135614;
      }
      QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                ((QMovableArrayOps<Symbol> *)&local_58,local_58.size,
                 (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
      QList<Symbol>::end((QList<Symbol> *)&local_58);
      lVar1 = (this->super_Parser).symbols.d.size;
      lVar5 = (this->super_Parser).index;
      if (lVar5 < lVar1) {
        pTVar7 = &(this->super_Parser).symbols.d.ptr[lVar5].token;
        do {
          lVar5 = lVar5 + 1;
          if (*pTVar7 != PP_WHITESPACE) break;
          (this->super_Parser).index = lVar5;
          pTVar7 = pTVar7 + 0xc;
        } while (lVar5 != lVar1);
      }
      lVar5 = (this->super_Parser).index;
      TVar4 = NOTOKEN;
      if (lVar5 < lVar1) {
        (this->super_Parser).index = lVar5 + 1;
        TVar4 = (this->super_Parser).symbols.d.ptr[lVar5].token;
      }
      iVar9 = 3;
      if (TVar4 != PP_RPAREN) {
        if (TVar4 == COMMA) {
          iVar9 = 2;
        }
        else {
          QByteArray::mid((longlong)&local_78,
                          (longlong)
                          &(this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lex);
          local_c0.d.d = (Data *)0x14a3f4;
          bVar2 = operator==(&local_78,(char **)&local_c0);
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (!bVar2) goto LAB_0013560d;
          m->isVariadic = true;
          lVar1 = (this->super_Parser).symbols.d.size;
          lVar5 = (this->super_Parser).index;
          if (lVar5 < lVar1) {
            pTVar7 = &(this->super_Parser).symbols.d.ptr[lVar5].token;
            do {
              lVar5 = lVar5 + 1;
              if (*pTVar7 != PP_WHITESPACE) break;
              (this->super_Parser).index = lVar5;
              pTVar7 = pTVar7 + 0xc;
            } while (lVar5 != lVar1);
          }
          lVar5 = (this->super_Parser).index;
          if ((lVar1 <= lVar5) || ((this->super_Parser).symbols.d.ptr[lVar5].token != PP_RPAREN))
          goto LAB_001355fb;
          (this->super_Parser).index = lVar5 + 1;
        }
      }
      if (pQStack_a0 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_a0,1,0x10);
        }
      }
    }
    else {
      iVar9 = 3;
      if (TVar4 != PP_RPAREN) {
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::mid((longlong)&local_78,
                        (longlong)
                        &(this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lex);
        local_a8 = "...";
        bVar2 = operator==(&local_78,(char **)&local_a8);
        if (bVar2) {
          m->isVariadic = true;
          iVar9 = (this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lineNum;
          QByteArray::QByteArray(&local_c0,"__VA_ARGS__",-1);
          local_a8 = (char *)CONCAT44(1,iVar9);
          pQStack_a0 = &(local_c0.d.d)->super_QArrayData;
          local_98 = local_c0.d.ptr;
          qStack_90 = local_c0.d.size;
          if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_88 = 0;
          qStack_80 = local_c0.d.size;
          QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                    ((QMovableArrayOps<Symbol> *)&local_58,local_58.size,(Symbol *)&local_a8);
          QList<Symbol>::end((QList<Symbol> *)&local_58);
          if (pQStack_a0 != (QArrayData *)0x0) {
            LOCK();
            (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQStack_a0,1,0x10);
            }
          }
          if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,0x10);
            }
          }
          lVar1 = (this->super_Parser).symbols.d.size;
          lVar5 = (this->super_Parser).index;
          if (lVar5 < lVar1) {
            pTVar7 = &(this->super_Parser).symbols.d.ptr[lVar5].token;
            do {
              lVar5 = lVar5 + 1;
              if (*pTVar7 != PP_WHITESPACE) break;
              (this->super_Parser).index = lVar5;
              pTVar7 = pTVar7 + 0xc;
            } while (lVar5 != lVar1);
          }
          lVar5 = (this->super_Parser).index;
          if ((lVar5 < lVar1) && ((this->super_Parser).symbols.d.ptr[lVar5].token == PP_RPAREN)) {
            (this->super_Parser).index = lVar5 + 1;
            iVar9 = 3;
LAB_00135294:
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
              }
            }
            if (!bVar2) goto LAB_001352c0;
            goto LAB_0013556a;
          }
LAB_001355fb:
          pcVar8 = "missing \')\' in macro argument list";
          goto LAB_00135614;
        }
        pcVar8 = local_78.d.ptr;
        if (local_78.d.ptr == (char *)0x0) {
          pcVar8 = (char *)&QByteArray::_empty;
        }
        bVar3 = is_identifier(pcVar8,local_78.d.size);
        iVar9 = 0;
        if (bVar3) goto LAB_00135294;
LAB_0013560d:
        pcVar8 = "Unexpected character in macro argument list.";
LAB_00135614:
        Parser::error(&this->super_Parser,pcVar8);
      }
    }
LAB_0013556a:
  } while (iVar9 != 3);
  QArrayDataPointer<Symbol>::operator=(&(m->arguments).d,&local_58);
  lVar1 = (this->super_Parser).symbols.d.size;
  lVar5 = (this->super_Parser).index;
  if (lVar5 < lVar1) {
    pTVar7 = &(this->super_Parser).symbols.d.ptr[lVar5].token;
    do {
      lVar5 = lVar5 + 1;
      if (*pTVar7 != PP_WHITESPACE) break;
      (this->super_Parser).index = lVar5;
      pTVar7 = pTVar7 + 0xc;
    } while (lVar5 != lVar1);
  }
  QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Preprocessor::parseDefineArguments(Macro *m)
{
    Symbols arguments;
    while (hasNext()) {
        while (test(PP_WHITESPACE)) {}
        Token t = next();
        if (t == PP_RPAREN)
            break;
        if (t != PP_IDENTIFIER) {
            QByteArray l = lexem();
            if (l == "...") {
                m->isVariadic = true;
                arguments += Symbol(symbol().lineNum, PP_IDENTIFIER, "__VA_ARGS__");
                while (test(PP_WHITESPACE)) {}
                if (!test(PP_RPAREN))
                    error("missing ')' in macro argument list");
                break;
            } else if (!is_identifier(l.constData(), l.size())) {
                error("Unexpected character in macro argument list.");
            }
        }

        Symbol arg = symbol();
        if (arguments.contains(arg))
            error("Duplicate macro parameter.");
        arguments += symbol();

        while (test(PP_WHITESPACE)) {}
        t = next();
        if (t == PP_RPAREN)
            break;
        if (t == PP_COMMA)
            continue;
        if (lexem() == "...") {
            //GCC extension:    #define FOO(x, y...) x(y)
            // The last argument was already parsed. Just mark the macro as variadic.
            m->isVariadic = true;
            while (test(PP_WHITESPACE)) {}
            if (!test(PP_RPAREN))
                error("missing ')' in macro argument list");
            break;
        }
        error("Unexpected character in macro argument list.");
    }
    m->arguments = arguments;
    while (test(PP_WHITESPACE)) {}
}